

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee754.h
# Opt level: O0

double __thiscall rapidjson::internal::Double::NextPositiveDouble(Double *this)

{
  bool bVar1;
  RapidJSONException *this_00;
  double dVar2;
  Double local_28 [3];
  Double *local_10;
  Double *this_local;
  
  local_10 = this;
  bVar1 = Sign(this);
  if (!bVar1) {
    Double(local_28,(this->field_0).u_ + 1);
    dVar2 = Value(local_28);
    return dVar2;
  }
  this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this_00,"rapidjson internal assertion failure: !Sign()");
  __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
              cereal::RapidJSONException::~RapidJSONException);
}

Assistant:

double NextPositiveDouble() const {
        CEREAL_RAPIDJSON_ASSERT(!Sign());
        return Double(u_ + 1).Value();
    }